

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsvg.c
# Opt level: O2

FT_Error tt_face_load_svg_doc(FT_GlyphSlot glyph,FT_UInt glyph_index)

{
  FT_UInt *pFVar1;
  FT_Memory memory;
  FT_Size pFVar2;
  undefined8 uVar3;
  FT_Fixed FVar4;
  FT_Fixed FVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  ushort uVar8;
  ushort uVar9;
  FT_Error FVar10;
  uint uVar11;
  FT_Byte *output;
  ulong uVar12;
  uint uVar13;
  FT_Byte *pFVar14;
  uint uVar15;
  uint uVar16;
  FT_Error local_80;
  FT_UInt local_7c;
  FT_ULong uncomp_size;
  ulong local_70;
  ulong local_68;
  FT_Face local_60;
  FT_GlyphSlot local_58;
  undefined8 *local_50;
  void *local_48;
  long local_40;
  FT_Byte *local_38;
  
  local_60 = glyph->face;
  local_48 = local_60[5].extensions;
  FVar10 = 8;
  if (*(ushort *)((long)local_48 + 2) != 0) {
    local_50 = (undefined8 *)glyph->other;
    memory = local_60->memory;
    local_40 = *(long *)((long)local_48 + 8);
    pFVar14 = (FT_Byte *)(local_40 + 2);
    uVar13 = *(ushort *)((long)local_48 + 2) - 1;
    local_7c = glyph_index;
    local_58 = glyph;
    extract_svg_doc((Svg_doc *)&uncomp_size,pFVar14);
    uVar8 = (ushort)uncomp_size;
    local_38 = pFVar14;
    extract_svg_doc((Svg_doc *)&uncomp_size,pFVar14 + uVar13 * 0xc);
    if ((local_7c < uVar8) || (((ushort)uncomp_size <= local_7c && (uncomp_size._2_2_ < local_7c))))
    {
      FVar10 = 0x10;
    }
    else {
      uVar16 = 0;
      while (uVar16 <= uVar13) {
        uVar15 = uVar16 + uVar13 >> 1;
        extract_svg_doc((Svg_doc *)&uncomp_size,local_38 + uVar15 * 0xc);
        uVar8 = (ushort)uncomp_size;
        uVar9 = uncomp_size._2_2_;
        uVar11 = (uint)(uncomp_size._2_2_ < local_7c);
        if (local_7c < (ushort)uncomp_size) {
          uVar11 = 0xffffffff;
        }
        if (uVar11 == 0xffffffff) {
          uVar13 = uVar15 - 1;
        }
        else {
          if (uVar11 != 1) {
            local_80 = 0;
            uVar12 = (*(long *)((long)local_48 + 0x10) - local_40) +
                     *(long *)((long)local_48 + 0x18);
            if (uVar12 - local_70 < local_68 || uVar12 < local_70) {
              return 8;
            }
            pFVar14 = (FT_Byte *)(local_40 + local_70);
            uncomp_size = local_68;
            if ((((6 < local_68) && (*pFVar14 == '\x1f')) && (pFVar14[1] == 0x8b)) &&
               (pFVar14[2] == '\b')) {
              uncomp_size = (FT_ULong)*(uint *)(pFVar14 + (local_68 - 4));
              output = (FT_Byte *)ft_mem_qalloc(memory,uncomp_size,&local_80);
              if (local_80 != 0) {
                return local_80;
              }
              local_80 = FT_Gzip_Uncompress(memory,output,&uncomp_size,pFVar14,local_68);
              if (local_80 != 0) {
                ft_mem_free(memory,output);
                return 8;
              }
              pFVar1 = &local_58->internal->flags;
              *pFVar1 = *pFVar1 | 2;
              local_60 = local_58->face;
              pFVar14 = output;
            }
            *local_50 = pFVar14;
            local_50[1] = uncomp_size;
            pFVar2 = local_60->size;
            local_50[8] = (pFVar2->metrics).max_advance;
            uVar3 = *(undefined8 *)&pFVar2->metrics;
            FVar4 = (pFVar2->metrics).x_scale;
            FVar5 = (pFVar2->metrics).y_scale;
            FVar6 = (pFVar2->metrics).ascender;
            FVar7 = (pFVar2->metrics).height;
            local_50[6] = (pFVar2->metrics).descender;
            local_50[7] = FVar7;
            local_50[4] = FVar5;
            local_50[5] = FVar6;
            local_50[2] = uVar3;
            local_50[3] = FVar4;
            *(FT_UShort *)(local_50 + 9) = local_58->face->units_per_EM;
            *(ushort *)((long)local_50 + 0x4a) = uVar8;
            *(ushort *)((long)local_50 + 0x4c) = uVar9;
            local_50[10] = 0x10000;
            local_50[0xb] = 0;
            local_50[0xc] = 0;
            local_50[0xd] = 0x10000;
            local_50[0xe] = 0;
            local_50[0xf] = 0;
            local_58->other = local_50;
            return 0;
          }
          uVar16 = uVar15 + 1;
        }
      }
      FVar10 = 0x10;
    }
  }
  return FVar10;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_svg_doc( FT_GlyphSlot  glyph,
                        FT_UInt       glyph_index )
  {
    FT_Error   error  = FT_Err_Ok;
    TT_Face    face   = (TT_Face)glyph->face;
    FT_Memory  memory = face->root.memory;
    Svg*       svg    = (Svg*)face->svg;

    FT_Byte*  doc_list;
    FT_ULong  doc_limit;

    FT_Byte*   doc;
    FT_ULong   doc_offset;
    FT_ULong   doc_length;
    FT_UShort  doc_start_glyph_id;
    FT_UShort  doc_end_glyph_id;

    FT_SVG_Document  svg_document = (FT_SVG_Document)glyph->other;


    FT_ASSERT( !( svg == NULL ) );

    doc_list = svg->svg_doc_list;

    error = find_doc( doc_list + 2, svg->num_entries, glyph_index,
                                    &doc_offset, &doc_length,
                                    &doc_start_glyph_id, &doc_end_glyph_id );
    if ( error != FT_Err_Ok )
      goto Exit;

    doc_limit = svg->table_size -
                  (FT_ULong)( doc_list - (FT_Byte*)svg->table );
    if ( doc_offset > doc_limit              ||
         doc_length > doc_limit - doc_offset )
    {
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    doc = doc_list + doc_offset;

    if ( doc_length > 6 &&
         doc[0] == 0x1F &&
         doc[1] == 0x8B &&
         doc[2] == 0x08 )
    {
#ifdef FT_CONFIG_OPTION_USE_ZLIB

      FT_ULong  uncomp_size;
      FT_Byte*  uncomp_buffer = NULL;


      /*
       * Get the size of the original document.  This helps in allotting the
       * buffer to accommodate the uncompressed version.  The last 4 bytes
       * of the compressed document are equal to the original size modulo
       * 2^32.  Since the size of SVG documents is less than 2^32 bytes we
       * can use this accurately.  The four bytes are stored in
       * little-endian format.
       */
      FT_TRACE4(( "SVG document is GZIP compressed\n" ));
      uncomp_size = (FT_ULong)doc[doc_length - 1] << 24 |
                    (FT_ULong)doc[doc_length - 2] << 16 |
                    (FT_ULong)doc[doc_length - 3] << 8  |
                    (FT_ULong)doc[doc_length - 4];

      if ( FT_QALLOC( uncomp_buffer, uncomp_size ) )
        goto Exit;

      error = FT_Gzip_Uncompress( memory,
                                  uncomp_buffer,
                                  &uncomp_size,
                                  doc,
                                  doc_length );
      if ( error )
      {
        FT_FREE( uncomp_buffer );
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      glyph->internal->flags |= FT_GLYPH_OWN_GZIP_SVG;

      doc        = uncomp_buffer;
      doc_length = uncomp_size;

#else /* !FT_CONFIG_OPTION_USE_ZLIB */

      error = FT_THROW( Unimplemented_Feature );
      goto Exit;

#endif /* !FT_CONFIG_OPTION_USE_ZLIB */
    }

    svg_document->svg_document        = doc;
    svg_document->svg_document_length = doc_length;

    svg_document->metrics      = glyph->face->size->metrics;
    svg_document->units_per_EM = glyph->face->units_per_EM;

    svg_document->start_glyph_id = doc_start_glyph_id;
    svg_document->end_glyph_id   = doc_end_glyph_id;

    svg_document->transform.xx = 0x10000;
    svg_document->transform.xy = 0;
    svg_document->transform.yx = 0;
    svg_document->transform.yy = 0x10000;

    svg_document->delta.x = 0;
    svg_document->delta.y = 0;

    FT_TRACE5(( "start_glyph_id: %d\n", doc_start_glyph_id ));
    FT_TRACE5(( "end_glyph_id:   %d\n", doc_end_glyph_id ));
    FT_TRACE5(( "svg_document:\n" ));
    FT_TRACE5(( " %.*s\n", (FT_UInt)doc_length, doc ));

    glyph->other = svg_document;

  Exit:
    return error;
  }